

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::append<char[1]>(path *this,char (*source) [1])

{
  path *ppVar1;
  path *in_stack_00000160;
  path *in_stack_00000168;
  format in_stack_ffffffffffffffc4;
  char (*in_stack_ffffffffffffffc8) [1];
  path *in_stack_ffffffffffffffd0;
  
  path<char[1],ghc::filesystem::path>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  ppVar1 = operator/=(in_stack_00000168,in_stack_00000160);
  ~path((path *)0x2985cf);
  return ppVar1;
}

Assistant:

inline path& path::append(const Source& source)
{
    return this->operator/=(path(source));
}